

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

void __thiscall
backward::Printer::print_trace(Printer *this,ostream *os,ResolvedTrace *trace,Colorize *colorize)

{
  bool bVar1;
  _Setw _Var2;
  ostream *poVar3;
  ostream *poVar4;
  void *this_00;
  long lVar5;
  Printer *this_01;
  undefined8 *in_RDX;
  ostream *in_RSI;
  SourceLoc *in_RDI;
  type in_stack_0000001c;
  SourceLoc *inliner_loc;
  size_t inliner_idx;
  bool already_indented;
  char *in_stack_00000030;
  void *in_stack_ffffffffffffffb0;
  const_reference in_stack_ffffffffffffffc8;
  
  poVar3 = std::operator<<(in_RSI,"#");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,Catch::clara::std::left);
  _Var2 = Catch::clara::std::setw(2);
  poVar4 = std::operator<<(poVar3,(_Setw)_Var2._M_n);
  this_00 = (void *)std::ostream::operator<<(poVar4,in_RDX[1]);
  std::ostream::operator<<(this_00,std::right);
  bVar1 = true;
  lVar5 = std::__cxx11::string::size();
  if ((lVar5 == 0) || ((in_RDI->field_0x9 & 1) != 0)) {
    poVar4 = std::operator<<(in_RSI,"   Object \"");
    poVar4 = std::operator<<(poVar4,(string *)(in_RDX + 2));
    poVar4 = std::operator<<(poVar4,"\", at ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(void *)*in_RDX);
    poVar4 = std::operator<<(poVar4,", in ");
    poVar4 = std::operator<<(poVar4,(string *)(in_RDX + 6));
    std::operator<<(poVar4,"\n");
    bVar1 = false;
  }
  for (this_01 = (Printer *)
                 std::
                 vector<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
                 ::size((vector<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
                         *)(in_RDX + 0x13)); this_01 != (Printer *)0x0;
      this_01 = (Printer *)((long)&this_01[-1]._snippets._src_files._M_h._M_single_bucket + 7)) {
    if (!bVar1) {
      std::operator<<(in_RSI,"   ");
    }
    in_stack_ffffffffffffffc8 =
         std::
         vector<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
         ::operator[]((vector<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
                       *)(in_RDX + 0x13),
                      (size_type)((long)&this_01[-1]._snippets._src_files._M_h._M_single_bucket + 7)
                     );
    print_source_loc(this_01,(ostream *)in_stack_ffffffffffffffc8,(char *)poVar3,in_RDI,
                     in_stack_ffffffffffffffb0);
    if (((byte)in_RDI->function & 1) != 0) {
      print_snippet((Printer *)trace,(ostream *)colorize,in_stack_00000030,(SourceLoc *)inliner_idx,
                    (Colorize *)inliner_loc,in_stack_0000001c,(int)this);
    }
    bVar1 = false;
  }
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    if (!bVar1) {
      std::operator<<(in_RSI,"   ");
    }
    print_source_loc(this_01,(ostream *)in_stack_ffffffffffffffc8,(char *)poVar3,in_RDI,
                     in_stack_ffffffffffffffb0);
    if (((byte)in_RDI->function & 1) != 0) {
      print_snippet((Printer *)trace,(ostream *)colorize,in_stack_00000030,(SourceLoc *)inliner_idx,
                    (Colorize *)inliner_loc,in_stack_0000001c,(int)this);
    }
  }
  return;
}

Assistant:

void print_trace(std::ostream &os, const ResolvedTrace &trace,
                   Colorize &colorize) {
    os << "#" << std::left << std::setw(2) << trace.idx << std::right;
    bool already_indented = true;

    if (!trace.source.filename.size() || object) {
      os << "   Object \"" << trace.object_filename << "\", at " << trace.addr
         << ", in " << trace.object_function << "\n";
      already_indented = false;
    }

    for (size_t inliner_idx = trace.inliners.size(); inliner_idx > 0;
         --inliner_idx) {
      if (!already_indented) {
        os << "   ";
      }
      const ResolvedTrace::SourceLoc &inliner_loc =
          trace.inliners[inliner_idx - 1];
      print_source_loc(os, " | ", inliner_loc);
      if (snippet) {
        print_snippet(os, "    | ", inliner_loc, colorize, Color::purple,
                      inliner_context_size);
      }
      already_indented = false;
    }

    if (trace.source.filename.size()) {
      if (!already_indented) {
        os << "   ";
      }
      print_source_loc(os, "   ", trace.source, trace.addr);
      if (snippet) {
        print_snippet(os, "      ", trace.source, colorize, Color::yellow,
                      trace_context_size);
      }
    }
  }